

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_rr1_mul(DisasContext_conflict14 *ctx)

{
  uint uVar1;
  TCGContext_conflict9 *tcg_ctx;
  TCGContext_conflict9 *pTVar2;
  uint uVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 arg;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *ts;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  ulong uVar9;
  uintptr_t o_1;
  uint uVar10;
  TCGContext_conflict9 *pTVar11;
  uintptr_t o_4;
  uintptr_t o;
  TCGTemp *pTVar12;
  uint uVar13;
  uintptr_t o_3;
  TCGTemp *local_a8;
  TCGv_i64 local_a0;
  TCGTemp *local_98;
  TCGTemp *local_90;
  TCGTemp *local_80;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i32 local_48;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  pTVar4 = tcg_const_i32_tricore(tcg_ctx,uVar1 >> 0x10 & 3);
  uVar3 = ctx->opcode >> 0x12 & 0x3ff;
  if (0x13 < uVar3 - 0xc) {
switchD_00d3145b_caseD_10:
    pTVar11 = ctx->uc->tcg_ctx;
    pTVar7 = tcg_const_i32_tricore(pTVar11,2);
    pTVar8 = tcg_const_i32_tricore(pTVar11,1);
    pTVar2 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                        (long)(int)(ctx->base).pc_next);
    local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
    pTVar12 = (TCGTemp *)(pTVar8 + (long)pTVar11);
    local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
    local_58 = pTVar12;
    tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
    (ctx->base).is_jmp = DISAS_NORETURN;
    tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
    goto LAB_00d3286a;
  }
  uVar13 = uVar1 >> 8 & 0xf;
  uVar10 = uVar1 >> 0xc & 0xf;
  uVar9 = (ulong)(uVar1 >> 0x1c);
  switch(uVar3) {
  case 0xc:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_70 - (long)tcg_ctx);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_80 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
    break;
  case 0xd:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_80 - (long)tcg_ctx);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_70 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
    break;
  case 0xe:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar12 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10]);
    goto LAB_00d320ef;
  case 0xf:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar12 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
LAB_00d320ef:
    local_68 = local_98;
    local_60 = local_90;
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_58 = pTVar12;
    local_50 = pTVar12;
    tcg_gen_callN_tricore
              (tcg_ctx,helper_mulr_h,
               (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr_d[uVar9]),5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,local_98);
    tcg_temp_free_internal_tricore(tcg_ctx,local_90);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar12);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    goto LAB_00d32167;
  default:
    goto switchD_00d3145b_caseD_10;
  case 0x18:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    local_98 = (TCGTemp *)((long)local_98 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_38 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_38 - (long)tcg_ctx);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_80 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_70 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
    goto LAB_00d32301;
  case 0x19:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    local_98 = (TCGTemp *)((long)local_98 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_70 - (long)tcg_ctx);
    local_38 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar7 = (TCGv_i32)((long)local_38 - (long)tcg_ctx);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_80 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore(tcg_ctx,pTVar7,tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
LAB_00d32301:
    tcg_gen_ext16s_i32_tricore(tcg_ctx,pTVar8,pTVar7);
    pTVar12 = local_38;
    local_68 = local_90;
    local_60 = local_80;
    local_58 = local_70;
    local_50 = local_38;
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_a8 = (TCGTemp *)((long)local_98 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_tricore(tcg_ctx,helper_mul_h,local_a8,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,local_90);
    tcg_temp_free_internal_tricore(tcg_ctx,local_80);
    tcg_temp_free_internal_tricore(tcg_ctx,local_70);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar12);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    pTVar8 = tcg_ctx->cpu_gpr_d[uVar9 + 1];
LAB_00d323a5:
    tcg_gen_extr_i64_i32_tricore(tcg_ctx,pTVar7,pTVar8,(TCGv_i64)local_98);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
LAB_00d323b2:
    gen_calc_usb_mul_h((DisasContext_conflict14 *)ctx->uc->tcg_ctx,pTVar7,
                       tcg_ctx->cpu_gpr_d[uVar9 + 1]);
LAB_00d323cf:
    tcg_temp_free_internal_tricore(tcg_ctx,local_a8);
    goto LAB_00d32874;
  case 0x1a:
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    pTVar5 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar6 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar6 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10]);
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_a8 = (TCGTemp *)((long)tcg_ctx + ((long)pTVar12 - (long)tcg_ctx));
    local_68 = pTVar5;
    local_60 = pTVar6;
    local_58 = ts;
    local_50 = ts;
    tcg_gen_callN_tricore(tcg_ctx,helper_mul_h,local_a8,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar5);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar6);
    tcg_temp_free_internal_tricore(tcg_ctx,ts);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx,tcg_ctx->cpu_gpr_d[uVar9],tcg_ctx->cpu_gpr_d[uVar9 + 1],
               (TCGv_i64)((long)pTVar12 - (long)tcg_ctx));
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    goto LAB_00d323b2;
  case 0x1b:
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    local_98 = (TCGTemp *)((long)local_98 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar5 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar6 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar12 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar6 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_a8 = (TCGTemp *)((long)tcg_ctx + (long)local_98);
    local_68 = pTVar12;
    local_60 = pTVar5;
    local_58 = pTVar6;
    local_50 = pTVar6;
    tcg_gen_callN_tricore(tcg_ctx,helper_mul_h,local_a8,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar12);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar5);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar6);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    pTVar8 = tcg_ctx->cpu_gpr_d[uVar9 + 1];
    goto LAB_00d323a5;
  case 0x1c:
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    local_a0 = (TCGv_i64)((long)pTVar12 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_70 - (long)tcg_ctx);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_80 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
    goto LAB_00d326d9;
  case 0x1d:
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    local_a0 = (TCGv_i64)((long)pTVar12 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    local_98 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_90 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    local_80 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar8 = (TCGv_i32)((long)local_80 - (long)tcg_ctx);
    local_70 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_98 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_90 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)local_70 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar10];
LAB_00d326d9:
    tcg_gen_ext16s_i32_tricore(tcg_ctx,pTVar8,pTVar7);
    local_68 = local_98;
    local_60 = local_90;
    local_58 = local_80;
    local_50 = local_70;
    local_48 = pTVar4 + (long)tcg_ctx;
    pTVar12 = (TCGTemp *)(local_a0 + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_tricore(tcg_ctx,helper_mulm_h,pTVar12,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,local_98);
    tcg_temp_free_internal_tricore(tcg_ctx,local_90);
    tcg_temp_free_internal_tricore(tcg_ctx,local_80);
    tcg_temp_free_internal_tricore(tcg_ctx,local_70);
    tcg_gen_extr_i64_i32_tricore
              (tcg_ctx,tcg_ctx->cpu_gpr_d[uVar9],tcg_ctx->cpu_gpr_d[uVar9 + 1],local_a0);
    tcg_gen_op2_tricore(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_PSW_V + (long)tcg_ctx),0);
    pTVar11 = tcg_ctx;
    if (tcg_ctx->cpu_PSW_AV != tcg_ctx->cpu_PSW_V) {
      tcg_gen_op2_tricore(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(tcg_ctx->cpu_PSW_AV + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_PSW_V + (long)tcg_ctx));
    }
LAB_00d3286a:
    tcg_temp_free_internal_tricore(pTVar11,pTVar12);
    goto LAB_00d32874;
  case 0x1e:
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    arg = (TCGv_i64)((long)pTVar12 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar5 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar6 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar12 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar6 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10]);
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_a8 = (TCGTemp *)((long)tcg_ctx + (long)arg);
    local_68 = pTVar12;
    local_60 = pTVar5;
    local_58 = pTVar6;
    local_50 = pTVar6;
    tcg_gen_callN_tricore(tcg_ctx,helper_mulm_h,local_a8,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar12);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar5);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar6);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    pTVar8 = tcg_ctx->cpu_gpr_d[uVar9 + 1];
    goto LAB_00d31ae5;
  case 0x1f:
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
    arg = (TCGv_i64)((long)pTVar12 - (long)tcg_ctx);
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar11 = ctx->uc->tcg_ctx;
      pTVar7 = tcg_const_i32_tricore(pTVar11,2);
      pTVar8 = tcg_const_i32_tricore(pTVar11,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_68 = (TCGTemp *)(pTVar11->cpu_env + (long)pTVar11);
      local_60 = (TCGTemp *)(pTVar7 + (long)pTVar11);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar11);
      tcg_gen_callN_tricore(pTVar11,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_68);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar7 + (long)pTVar11));
      tcg_temp_free_internal_tricore(pTVar11,(TCGTemp *)(pTVar8 + (long)pTVar11));
    }
    pTVar12 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar5 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar6 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar5 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13],0x10);
    tcg_gen_ext16s_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar12 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar13]);
    tcg_gen_sari_i32_tricore
              (tcg_ctx,(TCGv_i32)((long)pTVar6 - (long)tcg_ctx),tcg_ctx->cpu_gpr_d[uVar10],0x10);
    local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
    local_a8 = (TCGTemp *)((long)tcg_ctx + (long)arg);
    local_68 = pTVar12;
    local_60 = pTVar5;
    local_58 = pTVar6;
    local_50 = pTVar6;
    tcg_gen_callN_tricore(tcg_ctx,helper_mulm_h,local_a8,5,&local_68);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar12);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar5);
    tcg_temp_free_internal_tricore(tcg_ctx,pTVar6);
    pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
    pTVar8 = tcg_ctx->cpu_gpr_d[uVar9 + 1];
LAB_00d31ae5:
    tcg_gen_extr_i64_i32_tricore(tcg_ctx,pTVar7,pTVar8,arg);
    tcg_gen_op2_tricore(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_PSW_V + (long)tcg_ctx),0);
    if (tcg_ctx->cpu_PSW_AV != tcg_ctx->cpu_PSW_V) {
      tcg_gen_op2_tricore(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(tcg_ctx->cpu_PSW_AV + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_PSW_V + (long)tcg_ctx));
    }
    goto LAB_00d323cf;
  }
  tcg_gen_ext16s_i32_tricore(tcg_ctx,pTVar8,pTVar7);
  local_68 = local_98;
  local_60 = local_90;
  local_58 = local_80;
  local_50 = local_70;
  local_48 = pTVar4 + (long)&tcg_ctx->pool_cur;
  tcg_gen_callN_tricore
            (tcg_ctx,helper_mulr_h,
             (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr_d[uVar9]),5,&local_68);
  tcg_temp_free_internal_tricore(tcg_ctx,local_98);
  tcg_temp_free_internal_tricore(tcg_ctx,local_90);
  tcg_temp_free_internal_tricore(tcg_ctx,local_80);
  tcg_temp_free_internal_tricore(tcg_ctx,local_70);
  pTVar7 = tcg_ctx->cpu_gpr_d[uVar9];
LAB_00d32167:
  gen_calc_usb_mulr_h((DisasContext_conflict14 *)ctx->uc->tcg_ctx,pTVar7);
LAB_00d32874:
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  return;
}

Assistant:

static void decode_rr1_mul(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;

    int r1, r2, r3;
    TCGv n;
    TCGv_i64 temp64;

    r1 = MASK_OP_RR1_S1(ctx->opcode);
    r2 = MASK_OP_RR1_S2(ctx->opcode);
    r3 = MASK_OP_RR1_D(ctx->opcode);
    n  = tcg_const_i32(tcg_ctx, MASK_OP_RR1_N(ctx->opcode));
    op2 = MASK_OP_RR1_OP2(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR1_MUL_H_32_LL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LL(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_LU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LU(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_UL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UL(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MUL_H_32_UU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UU(tcg_ctx, mul_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        gen_calc_usb_mul_h(ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1]);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_LL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LL(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_LU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_LU(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_UL:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UL(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);
        break;
    case OPC2_32_RR1_MULM_H_64_UU:
        temp64 = tcg_temp_new_i64(tcg_ctx);
        CHECK_REG_PAIR(r3);
        GEN_HELPER_UU(tcg_ctx, mulm_h, temp64, tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r3+1], temp64);
        /* reset V bit */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
        /* reset AV bit */
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_V);
        tcg_temp_free_i64(tcg_ctx, temp64);

        break;
    case OPC2_32_RR1_MULR_H_16_LL:
        GEN_HELPER_LL(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_LU:
        GEN_HELPER_LU(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_UL:
        GEN_HELPER_UL(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    case OPC2_32_RR1_MULR_H_16_UU:
        GEN_HELPER_UU(tcg_ctx, mulr_h, tcg_ctx->cpu_gpr_d[r3], tcg_ctx->cpu_gpr_d[r1], tcg_ctx->cpu_gpr_d[r2], n);
        gen_calc_usb_mulr_h(ctx, tcg_ctx->cpu_gpr_d[r3]);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, n);
}